

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_1::PosixEnv::PosixEnv(PosixEnv *this)

{
  int iVar1;
  PosixEnv *this_local;
  
  Env::Env(&this->super_Env);
  (this->super_Env)._vptr_Env = (_func_int **)&PTR__PosixEnv_0011e818;
  port::Mutex::Mutex(&this->background_work_mutex_);
  port::CondVar::CondVar(&this->background_work_cv_,&this->background_work_mutex_);
  this->started_background_thread_ = false;
  std::
  queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>>>
  ::
  queue<std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>>,void>
            ((queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>>>
              *)&this->background_work_queue_);
  PosixLockTable::PosixLockTable(&this->locks_);
  iVar1 = MaxMmaps();
  Limiter::Limiter(&this->mmap_limiter_,iVar1);
  iVar1 = MaxOpenFiles();
  Limiter::Limiter(&this->fd_limiter_,iVar1);
  return;
}

Assistant:

PosixEnv::PosixEnv()
    : background_work_cv_(&background_work_mutex_),
      started_background_thread_(false),
      mmap_limiter_(MaxMmaps()),
      fd_limiter_(MaxOpenFiles()) {}